

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QDateTime>::moveAppend
          (QGenericArrayOps<QDateTime> *this,QDateTime *b,QDateTime *e)

{
  qsizetype *pqVar1;
  QDateTime *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QDateTime>).ptr;
    for (; b < e; b = b + 8) {
      QDateTime::QDateTime(pQVar2 + (this->super_QArrayDataPointer<QDateTime>).size * 8,b);
      pqVar1 = &(this->super_QArrayDataPointer<QDateTime>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }